

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LocalAccessChainConvertPass::FindTargetVars
          (LocalAccessChainConvertPass *this,Function *func)

{
  Op opcode;
  Instruction *ip;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *this_00;
  BasicBlock *pBVar4;
  Instruction **ppIVar5;
  pointer puVar6;
  __ireturn_type _Var7;
  uint32_t varId;
  uint32_t local_4c;
  Function *local_48;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  puVar6 = (func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&(this->super_MemPass).seen_non_target_vars_;
  local_40 = &(this->super_MemPass).seen_target_vars_._M_h;
  local_48 = func;
  do {
    if (puVar6 == (local_48->blocks_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pBVar4 = (puVar6->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar5 = (Instruction **)
              ((long)&(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while (ip = *ppIVar5,
          ip != &(pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if (ip->opcode_ - OpLoad < 2) {
        this_00 = MemPass::GetPtr(&this->super_MemPass,ip,&local_4c);
        bVar1 = MemPass::IsTargetVar(&this->super_MemPass,local_4c);
        if (!bVar1) goto LAB_0050af50;
        opcode = this_00->opcode_;
        bVar1 = HasOnlySupportedRefs(this,local_4c);
        if (bVar1) {
          bVar1 = MemPass::IsNonPtrAccessChain(&this->super_MemPass,opcode);
          if (bVar1) {
            uVar3 = Instruction::GetSingleWordInOperand(this_00,0);
            if (uVar3 != local_4c) goto LAB_0050af36;
          }
          bVar2 = Is32BitConstantIndexAccessChain(this,this_00);
          if (!bVar2) goto LAB_0050af36;
          if (bVar1) {
            bVar1 = AnyIndexIsOutOfBounds(this,this_00);
            if (bVar1) goto LAB_0050af36;
          }
        }
        else {
LAB_0050af36:
          _Var7 = std::__detail::
                  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::insert(local_38,&local_4c);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(local_40,&local_4c,_Var7._8_8_);
        }
LAB_0050af50:
        pBVar4 = (puVar6->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      }
      ppIVar5 = &(ip->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void LocalAccessChainConvertPass::FindTargetVars(Function* func) {
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      switch (ii->opcode()) {
        case spv::Op::OpStore:
        case spv::Op::OpLoad: {
          uint32_t varId;
          Instruction* ptrInst = GetPtr(&*ii, &varId);
          if (!IsTargetVar(varId)) break;
          const spv::Op op = ptrInst->opcode();
          // Rule out variables with non-supported refs eg function calls
          if (!HasOnlySupportedRefs(varId)) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }
          // Rule out variables with nested access chains
          // TODO(): Convert nested access chains
          bool is_non_ptr_access_chain = IsNonPtrAccessChain(op);
          if (is_non_ptr_access_chain && ptrInst->GetSingleWordInOperand(
                                             kAccessChainPtrIdInIdx) != varId) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }
          // Rule out variables accessed with non-constant indices
          if (!Is32BitConstantIndexAccessChain(ptrInst)) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }

          if (is_non_ptr_access_chain && AnyIndexIsOutOfBounds(ptrInst)) {
            seen_non_target_vars_.insert(varId);
            seen_target_vars_.erase(varId);
            break;
          }
        } break;
        default:
          break;
      }
    }
  }
}